

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O2

void Centaurus::emit_parser_prolog(X86Assembler *as)

{
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x510));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x500));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4d0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4f0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4e0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4a0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x490));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)(asmjit::x86OpData + 0x4b0));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x510),
             (Operand_ *)(asmjit::x86OpData + 0x4c0));
  return;
}

Assistant:

static void emit_parser_prolog(asmjit::X86Assembler& as)
{
    as.push(asmjit::x86::r9);
    as.push(asmjit::x86::r8);
    as.push(asmjit::x86::rbp);
    as.push(asmjit::x86::rdi);
    as.push(asmjit::x86::rsi);
    as.push(asmjit::x86::rdx);
    as.push(asmjit::x86::rcx);
    as.push(asmjit::x86::rbx);

    //Save RSP for bailout
    as.mov(asmjit::x86::r9, asmjit::x86::rsp);
}